

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall helics::apps::AppTextParser::AppTextParser(AppTextParser *this,string *filename)

{
  string *in_RSI;
  undefined1 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = 0;
  std::ifstream::ifstream(in_RDI + 8,in_RSI,_S_in);
  std::__cxx11::string::string(in_stack_ffffffffffffffe0);
  std::__cxx11::string::string(in_stack_00000010,in_stack_00000008);
  *(undefined4 *)(in_RDI + 0x250) = 0;
  return;
}

Assistant:

AppTextParser::AppTextParser(const std::string& filename): filePtr(filename), mFileName(filename) {}